

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseBlanketJSCoverage.cxx
# Opt level: O1

bool __thiscall cmParseBlanketJSCoverage::ReadJSONFile(cmParseBlanketJSCoverage *this,string *file)

{
  cmCTest *this_00;
  ostream *poVar1;
  JSONParser parser;
  ostringstream cmCTestLog_msg;
  long *local_1c0;
  long local_1b0 [2];
  JSONParser local_1a0;
  undefined1 local_190 [376];
  
  local_1a0.Coverage = this->Coverage;
  local_1a0._vptr_JSONParser = (_func_int **)&PTR__JSONParser_00714d88;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Parsing ",8);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_190,(file->_M_dataplus)._M_p,file->_M_string_length);
  std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  this_00 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(this_00,5,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmParseBlanketJSCoverage.cxx"
               ,0x86,(char *)local_1c0,this->Coverage->Quiet);
  if (local_1c0 != local_1b0) {
    operator_delete(local_1c0,local_1b0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  JSONParser::ParseFile(&local_1a0,file);
  return true;
}

Assistant:

bool cmParseBlanketJSCoverage::ReadJSONFile(std::string const& file)
{
  cmParseBlanketJSCoverage::JSONParser parser(this->Coverage);
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "Parsing " << file << std::endl, this->Coverage.Quiet);
  parser.ParseFile(file);
  return true;
}